

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

int xmlHashUpdateEntry3(xmlHashTablePtr table,xmlChar *name,xmlChar *name2,xmlChar *name3,
                       void *userdata,xmlHashDeallocator f)

{
  int iVar1;
  int iVar2;
  unsigned_long uVar3;
  _xmlHashEntry *p_Var4;
  xmlChar *pxVar5;
  _xmlHashEntry *p_Var6;
  xmlChar *local_50;
  
  if (name == (xmlChar *)0x0 || table == (xmlHashTablePtr)0x0) {
    return -1;
  }
  local_50 = name3;
  if (table->dict != (xmlDictPtr)0x0) {
    iVar1 = xmlDictOwns(table->dict,name);
    if ((iVar1 == 0) && (name = xmlDictLookup(table->dict,name,-1), name == (xmlChar *)0x0)) {
      return -1;
    }
    if (name2 == (xmlChar *)0x0) {
      name2 = (xmlChar *)0x0;
    }
    else {
      iVar1 = xmlDictOwns(table->dict,name2);
      if ((iVar1 == 0) && (name2 = xmlDictLookup(table->dict,name2,-1), name2 == (xmlChar *)0x0)) {
        return -1;
      }
    }
    if (name3 == (xmlChar *)0x0) {
      local_50 = (xmlChar *)0x0;
    }
    else {
      iVar1 = xmlDictOwns(table->dict,name3);
      if ((iVar1 == 0) &&
         (local_50 = xmlDictLookup(table->dict,name3,-1), local_50 == (xmlChar *)0x0)) {
        return -1;
      }
    }
  }
  uVar3 = xmlHashComputeKey(table,name,name2,local_50);
  p_Var4 = table->table + uVar3;
  iVar1 = table->table[uVar3].valid;
  if (iVar1 == 0) {
    p_Var6 = (_xmlHashEntry *)0x0;
  }
  else {
    if (table->dict != (xmlDictPtr)0x0) {
      do {
        p_Var6 = p_Var4;
        p_Var4 = p_Var6->next;
        pxVar5 = p_Var6->name;
        if (p_Var4 == (_xmlHashEntry *)0x0) {
          if (((pxVar5 != name) || (p_Var6->name2 != name2)) || (p_Var6->name3 != local_50))
          goto LAB_0014845b;
          break;
        }
      } while (((pxVar5 != name) || (p_Var6->name2 != name2)) || (p_Var6->name3 != local_50));
      if (f != (xmlHashDeallocator)0x0) {
        (*f)(p_Var6->payload,pxVar5);
      }
      p_Var6->payload = userdata;
      return 0;
    }
    for (; p_Var6 = p_Var4->next, iVar2 = xmlStrEqual(p_Var4->name,name),
        p_Var6 != (_xmlHashEntry *)0x0; p_Var4 = p_Var4->next) {
      if (((iVar2 != 0) && (iVar2 = xmlStrEqual(p_Var4->name2,name2), iVar2 != 0)) &&
         (iVar2 = xmlStrEqual(p_Var4->name3,local_50), iVar2 != 0)) goto LAB_00148406;
    }
    p_Var6 = p_Var4;
    if (((iVar2 != 0) && (iVar2 = xmlStrEqual(p_Var4->name2,name2), iVar2 != 0)) &&
       (iVar2 = xmlStrEqual(p_Var4->name3,local_50), iVar2 != 0)) {
LAB_00148406:
      if (f != (xmlHashDeallocator)0x0) {
        (*f)(p_Var4->payload,p_Var4->name);
      }
      p_Var4->payload = userdata;
      return 0;
    }
LAB_0014845b:
    p_Var4 = (_xmlHashEntry *)(*xmlMalloc)(0x30);
    if (p_Var4 == (_xmlHashEntry *)0x0) {
      return -1;
    }
  }
  if (table->dict == (xmlDictPtr)0x0) {
    pxVar5 = xmlStrdup(name);
    p_Var4->name = pxVar5;
    pxVar5 = xmlStrdup(name2);
    p_Var4->name2 = pxVar5;
    local_50 = xmlStrdup(local_50);
  }
  else {
    p_Var4->name = name;
    p_Var4->name2 = name2;
  }
  p_Var4->name3 = local_50;
  p_Var4->payload = userdata;
  p_Var4->next = (_xmlHashEntry *)0x0;
  p_Var4->valid = 1;
  table->nbElems = table->nbElems + 1;
  if (iVar1 != 0) {
    p_Var6->next = p_Var4;
  }
  return 0;
}

Assistant:

int
xmlHashUpdateEntry3(xmlHashTablePtr table, const xmlChar *name,
	           const xmlChar *name2, const xmlChar *name3,
		   void *userdata, xmlHashDeallocator f) {
    unsigned long key;
    xmlHashEntryPtr entry;
    xmlHashEntryPtr insert;

    if ((table == NULL) || name == NULL)
	return(-1);

    /*
     * If using a dict internalize if needed
     */
    if (table->dict) {
        if (!xmlDictOwns(table->dict, name)) {
	    name = xmlDictLookup(table->dict, name, -1);
	    if (name == NULL)
	        return(-1);
	}
        if ((name2 != NULL) && (!xmlDictOwns(table->dict, name2))) {
	    name2 = xmlDictLookup(table->dict, name2, -1);
	    if (name2 == NULL)
	        return(-1);
	}
        if ((name3 != NULL) && (!xmlDictOwns(table->dict, name3))) {
	    name3 = xmlDictLookup(table->dict, name3, -1);
	    if (name3 == NULL)
	        return(-1);
	}
    }

    /*
     * Check for duplicate and insertion location.
     */
    key = xmlHashComputeKey(table, name, name2, name3);
    if (table->table[key].valid == 0) {
	insert = NULL;
    } else {
        if (table ->dict) {
	    for (insert = &(table->table[key]); insert->next != NULL;
		 insert = insert->next) {
		if ((insert->name == name) &&
		    (insert->name2 == name2) &&
		    (insert->name3 == name3)) {
		    if (f)
			f(insert->payload, insert->name);
		    insert->payload = userdata;
		    return(0);
		}
	    }
	    if ((insert->name == name) &&
		(insert->name2 == name2) &&
		(insert->name3 == name3)) {
		if (f)
		    f(insert->payload, insert->name);
		insert->payload = userdata;
		return(0);
	    }
	} else {
	    for (insert = &(table->table[key]); insert->next != NULL;
		 insert = insert->next) {
		if ((xmlStrEqual(insert->name, name)) &&
		    (xmlStrEqual(insert->name2, name2)) &&
		    (xmlStrEqual(insert->name3, name3))) {
		    if (f)
			f(insert->payload, insert->name);
		    insert->payload = userdata;
		    return(0);
		}
	    }
	    if ((xmlStrEqual(insert->name, name)) &&
		(xmlStrEqual(insert->name2, name2)) &&
		(xmlStrEqual(insert->name3, name3))) {
		if (f)
		    f(insert->payload, insert->name);
		insert->payload = userdata;
		return(0);
	    }
	}
    }

    if (insert == NULL) {
	entry =  &(table->table[key]);
    } else {
	entry = xmlMalloc(sizeof(xmlHashEntry));
	if (entry == NULL)
	     return(-1);
    }

    if (table->dict != NULL) {
        entry->name = (xmlChar *) name;
        entry->name2 = (xmlChar *) name2;
        entry->name3 = (xmlChar *) name3;
    } else {
	entry->name = xmlStrdup(name);
	entry->name2 = xmlStrdup(name2);
	entry->name3 = xmlStrdup(name3);
    }
    entry->payload = userdata;
    entry->next = NULL;
    entry->valid = 1;
    table->nbElems++;


    if (insert != NULL) {
	insert->next = entry;
    }
    return(0);
}